

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void kj::Directory::commitFailed(WriteMode mode)

{
  int line;
  char *macroArgs;
  Fault f;
  char *params;
  Fault local_10;
  
  if ((mode & (MODIFY|CREATE)) == CREATE) {
    params = "replace target already exists";
    macroArgs = "\"replace target already exists\"";
    line = 0x2fb;
  }
  else {
    if ((mode & (MODIFY|CREATE)) != MODIFY) {
      if ((mode & (MODIFY|CREATE)) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                  (&local_10,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x2ff,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\"",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given");
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&local_10,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x301,FAILED,(char *)0x0,
                   "\"tryCommit() returned null despite no preconditions\"",
                   (char (*) [51])"tryCommit() returned null despite no preconditions");
      }
      goto LAB_001fa8a4;
    }
    params = "replace target does not exist";
    macroArgs = "\"replace target does not exist\"";
    line = 0x2fd;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,line,FAILED,(char *)0x0,macroArgs,(char (*) [30])params);
LAB_001fa8a4:
  kj::_::Debug::Fault::~Fault(&local_10);
  return;
}

Assistant:

void Directory::commitFailed(WriteMode mode) {
  if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("replace target already exists") { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("replace target does not exist") { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given") { break; }
  } else {
    KJ_FAIL_ASSERT("tryCommit() returned null despite no preconditions") { break; }
  }
}